

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Abbrev>::~Expected
          (Expected<llvm::DWARFDebugNames::Abbrev> *this)

{
  error_type *this_00;
  storage_type *psVar1;
  
  if ((this->field_0x20 & 1) != 0) {
    this_00 = getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (this_00);
    return;
  }
  psVar1 = getStorage(this);
  std::
  _Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ::~_Vector_base(&(psVar1->Attributes).
                   super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                 );
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }